

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::InputFile::InputFile(InputFile *this,InputPartData *part)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->_ctxt)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (part->context)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (part->context)._ctxt.
           super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->_ctxt)._ctxt.super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe8);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e5610;
  iVar1 = part->numThreads;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[2]._M_weak_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  *(InputFile **)&p_Var2[3]._M_use_count = this;
  *(int *)&p_Var2[4]._vptr__Sp_counted_base = iVar1;
  p_Var2[9]._M_use_count = 0;
  p_Var2[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[4]._M_use_count = 0;
  p_Var2[4]._M_weak_count = 0;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[5]._M_use_count = 0;
  p_Var2[5]._M_weak_count = 0;
  p_Var2[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[6]._M_use_count = 0;
  p_Var2[6]._M_weak_count = 0;
  p_Var2[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[7]._M_use_count = 0;
  p_Var2[7]._M_weak_count = 0;
  p_Var2[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[8]._M_use_count = 0;
  p_Var2[8]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var2[10]._M_use_count = &p_Var2[9]._M_use_count;
  p_Var2[0xb]._vptr__Sp_counted_base = (_func_int **)&p_Var2[9]._M_use_count;
  p_Var2[0xb]._M_use_count = 0;
  p_Var2[0xb]._M_weak_count = 0;
  *(undefined4 *)&p_Var2[0xc]._vptr__Sp_counted_base = 0xffffffff;
  *(undefined8 *)((long)&p_Var2[0xc]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var2[0xc]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[0xd]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var2[0xd]._M_weak_count = 0;
  *(undefined4 *)((long)&p_Var2[0xe]._vptr__Sp_counted_base + 4) = 0;
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  *(InputPartData **)&p_Var2[4]._M_use_count = part;
  initialize(this);
  return;
}

Assistant:

InputFile::InputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->numThreads))
{
    _data->_part = part;
    initialize ();
}